

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  ImGuiStoragePair *pIVar1;
  ulong uVar2;
  ImGuiStoragePair *it;
  ulong uVar3;
  ulong uVar4;
  ImGuiStoragePair local_10;
  
  pIVar1 = (this->Data).Data;
  uVar3 = (ulong)(this->Data).Size;
  it = pIVar1;
  uVar4 = uVar3;
  while (uVar2 = uVar4, uVar2 != 0) {
    uVar4 = uVar2 >> 1;
    if (it[uVar4].key < key) {
      it = it + uVar4 + 1;
      uVar4 = ~uVar4 + uVar2;
    }
  }
  if ((it == pIVar1 + uVar3) || (it->key != key)) {
    local_10.key = key;
    local_10.field_1.val_p = default_val;
    it = ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it,&local_10);
  }
  return (void **)&it->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_p;
}